

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O1

void stbir__simple_alpha_unweight_2ch(float *encode_buffer,int width_times_channels)

{
  float *pfVar1;
  
  pfVar1 = encode_buffer + width_times_channels;
  do {
    if (7.523164e-37 <= encode_buffer[1]) {
      *encode_buffer = *encode_buffer / encode_buffer[1];
    }
    encode_buffer = encode_buffer + 2;
  } while (encode_buffer < pfVar1);
  return;
}

Assistant:

static void stbir__simple_alpha_unweight_2ch( float * encode_buffer, int width_times_channels )
{
  float STBIR_SIMD_STREAMOUT_PTR(*) encode = encode_buffer;
  float const * end_output = encode_buffer + width_times_channels;

  do {
    float alpha = encode[1];
    if ( alpha >= stbir__small_float )
      encode[0] /= alpha;
    encode += 2;
  } while ( encode < end_output );
}